

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RsIfElseSyntax::setChild(RsIfElseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  RsElseClauseSyntax *pRVar2;
  logic_error *this_00;
  Token TVar3;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 6) {
    switch(index) {
    case 0:
      TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->keyword).kind = TVar3.kind;
      (this->keyword).field_0x2 = TVar3._2_1_;
      (this->keyword).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
      (this->keyword).rawLen = TVar3.rawLen;
      (this->keyword).info = TVar3.info;
      break;
    case 1:
      TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openParen).kind = TVar3.kind;
      (this->openParen).field_0x2 = TVar3._2_1_;
      (this->openParen).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
      (this->openParen).rawLen = TVar3.rawLen;
      (this->openParen).info = TVar3.info;
      break;
    case 2:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1)
        ;
      }
      not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
                ((not_null<slang::syntax::ExpressionSyntax*> *)&local_b8,
                 (ExpressionSyntax **)&local_d8);
      (this->condition).ptr = (ExpressionSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 3:
      TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeParen).kind = TVar3.kind;
      (this->closeParen).field_0x2 = TVar3._2_1_;
      (this->closeParen).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
      (this->closeParen).rawLen = TVar3.rawLen;
      (this->closeParen).info = TVar3.info;
      break;
    case 4:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::RsProdItemSyntax>(pSVar1)
        ;
      }
      not_null<slang::syntax::RsProdItemSyntax*>::not_null<slang::syntax::RsProdItemSyntax*,void>
                ((not_null<slang::syntax::RsProdItemSyntax*> *)&local_b8,
                 (RsProdItemSyntax **)&local_d8);
      (this->ifItem).ptr = (RsProdItemSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 5:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        pRVar2 = (RsElseClauseSyntax *)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        pRVar2 = SyntaxNode::as<slang::syntax::RsElseClauseSyntax>(pSVar1);
      }
      this->elseClause = pRVar2;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x2c3f);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void RsIfElseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: condition = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        case 4: ifItem = child.node() ? &child.node()->as<RsProdItemSyntax>() : nullptr; return;
        case 5: elseClause = child.node() ? &child.node()->as<RsElseClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}